

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O2

UBool __thiscall
icu_63::TimeZoneNames::MatchInfoCollection::getTimeZoneIDAt
          (MatchInfoCollection *this,int32_t idx,UnicodeString *tzID)

{
  ushort uVar1;
  UBool UVar2;
  ushort uVar3;
  void *pvVar4;
  
  uVar1 = (tzID->fUnion).fStackFields.fLengthAndFlags;
  uVar3 = 2;
  if ((uVar1 & 1) == 0) {
    uVar3 = uVar1 & 0x1e;
  }
  (tzID->fUnion).fStackFields.fLengthAndFlags = uVar3;
  pvVar4 = UVector::elementAt(this->fMatches,idx);
  if ((pvVar4 == (void *)0x0) || (*(char *)((long)pvVar4 + 0x4c) == '\0')) {
    UVar2 = '\0';
  }
  else {
    UnicodeString::setTo(tzID,(UnicodeString *)((long)pvVar4 + 8));
    UVar2 = '\x01';
  }
  return UVar2;
}

Assistant:

UBool
TimeZoneNames::MatchInfoCollection::getTimeZoneIDAt(int32_t idx, UnicodeString& tzID) const {
    tzID.remove();
    const MatchInfo* match = (const MatchInfo*)fMatches->elementAt(idx);
    if (match && match->isTZID) {
        tzID.setTo(match->id);
        return TRUE;
    }
    return FALSE;
}